

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LU(TPZMatrix<std::complex<double>_> *this)

{
  long lVar1;
  double dVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  undefined8 uVar7;
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [24];
  long local_80;
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  
  bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar3) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar3 == 0) {
    local_a8 = 0.0;
    dStack_a0 = 0.0;
    local_80 = (this->super_TPZBaseMatrix).fRow;
    lVar4 = (this->super_TPZBaseMatrix).fCol;
    if (lVar4 < local_80) {
      local_80 = lVar4;
    }
    if (0 < local_80) {
      lVar4 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
        local_78 = in_XMM1_Qa;
        dVar2 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        in_XMM1_Qa = 1e-12;
        uVar7 = 0;
        if (ABS(dVar2) < 1e-12) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar1 = lVar4 + 1;
        lVar5 = lVar1;
        if (lVar1 < (this->super_TPZBaseMatrix).fRow) {
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar4)
            ;
            local_a8 = (double)__divdc3();
            dStack_a0 = in_XMM1_Qa;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar5,lVar4,&local_a8);
            lVar6 = lVar1;
            if (lVar1 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar6);
                local_58 = in_XMM1_Qa;
                uStack_50 = uVar7;
                local_48 = extraout_XMM0_Da_00;
                uStack_44 = extraout_XMM0_Db_00;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar4,lVar6);
                local_98._0_8_ = local_a8;
                local_98._8_8_ = dStack_a0;
                local_68._8_8_ = in_XMM1_Qa;
                std::complex<double>::operator*=
                          ((complex<double> *)local_98,(complex<double> *)local_68);
                dVar2 = local_58 - (double)local_98._8_8_;
                local_98._8_4_ = SUB84(dVar2,0);
                local_98._0_8_ = (double)CONCAT44(uStack_44,local_48) - (double)local_98._0_8_;
                local_98._12_4_ = (int)((ulong)dVar2 >> 0x20);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar5,lVar6,(complex<double> *)local_98);
                lVar6 = lVar6 + 1;
              } while (lVar6 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar4 = lVar1;
      } while (lVar1 != local_80);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}